

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcBlendEquationAdvancedTests.cpp
# Opt level: O2

string * __thiscall
glcts::GetSolidShader_abi_cxx11_
          (string *__return_storage_ptr__,glcts *this,char *layoutQualifier,char *glslVersion,
          char *extensionDirective)

{
  mapped_type *pmVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  args;
  allocator<char> local_f3;
  allocator<char> local_f2;
  allocator<char> local_f1;
  key_type local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  key_type local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  local_b0._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_b0._M_impl.super__Rb_tree_header._M_header;
  local_b0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_b0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_b0._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_b0._M_impl.super__Rb_tree_header._M_header._M_right =
       local_b0._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f0,"VERSION_DIRECTIVE",(allocator<char> *)&local_d0);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&local_b0,&local_f0);
  std::__cxx11::string::assign((char *)pmVar1);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f0,"EXTENSION_DIRECTIVE",(allocator<char> *)&local_d0);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&local_b0,&local_f0);
  std::__cxx11::string::assign((char *)pmVar1);
  std::__cxx11::string::~string((string *)&local_f0);
  if (this == (glcts *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f0,"LAYOUT_QUALIFIER",(allocator<char> *)&local_d0);
    pmVar1 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)&local_b0,&local_f0);
    std::__cxx11::string::assign((char *)pmVar1);
    this_00 = &local_f0;
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"layout (",&local_f1);
    std::operator+(&local_d0,&local_80,(char *)this);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,") out;",&local_f2);
    std::operator+(&local_f0,&local_d0,&local_40);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_60,"LAYOUT_QUALIFIER",&local_f3);
    pmVar1 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)&local_b0,&local_60);
    std::__cxx11::string::operator=((string *)pmVar1,(string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_40);
    std::__cxx11::string::~string((string *)&local_d0);
    this_00 = &local_80;
  }
  std::__cxx11::string::~string((string *)this_00);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d0,
             "${VERSION_DIRECTIVE}\n${EXTENSION_DIRECTIVE}\n\nprecision highp float;\n\n${LAYOUT_QUALIFIER}\nlayout (location = 0) out vec4 oCol;\n\nuniform vec4 uSrcCol;\n\nvoid main (void) {\n   oCol = uSrcCol;\n}\n"
             ,(allocator<char> *)&local_80);
  tcu::StringTemplate::StringTemplate((StringTemplate *)&local_f0,&local_d0);
  tcu::StringTemplate::specialize
            (__return_storage_ptr__,(StringTemplate *)&local_f0,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&local_b0);
  tcu::StringTemplate::~StringTemplate((StringTemplate *)&local_f0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_b0);
  return __return_storage_ptr__;
}

Assistant:

static std::string GetSolidShader(
	const char* layoutQualifier, const char* glslVersion,
	const char* extensionDirective = "#extension GL_KHR_blend_equation_advanced : require")
{
	static const char* frgSrcTemplate = "${VERSION_DIRECTIVE}\n"
										"${EXTENSION_DIRECTIVE}\n"
										"\n"
										"precision highp float;\n"
										"\n"
										"${LAYOUT_QUALIFIER}\n"
										"layout (location = 0) out vec4 oCol;\n"
										"\n"
										"uniform vec4 uSrcCol;\n"
										"\n"
										"void main (void) {\n"
										"   oCol = uSrcCol;\n"
										"}\n";

	std::map<std::string, std::string> args;
	args["VERSION_DIRECTIVE"]   = glslVersion;
	args["EXTENSION_DIRECTIVE"] = extensionDirective;
	if (layoutQualifier)
		args["LAYOUT_QUALIFIER"] = std::string("layout (") + layoutQualifier + std::string(") out;");
	else
		args["LAYOUT_QUALIFIER"] = ""; // none

	return tcu::StringTemplate(frgSrcTemplate).specialize(args);
}